

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall
Jinx::Impl::PropertyName::PropertyName
          (PropertyName *this,VisibilityType visibility,bool readOnly,String *moduleName,
          String *propertyName,Variant *defaultValue)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *pbVar2;
  uint64_t uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar4;
  size_t sVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> __str;
  String combinedName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_50;
  
  this->m_id = 0;
  this->m_visibility = visibility;
  this->m_readOnly = readOnly;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (propertyName->_M_dataplus)._M_p;
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::_M_construct<char*>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&this->m_name,pcVar1
             ,pcVar1 + propertyName->_M_string_length);
  Variant::Copy(&this->m_defaultValue,defaultValue);
  this->m_partCount = 0;
  pcVar1 = (moduleName->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::_M_construct<char*>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_70,pcVar1,
             pcVar1 + moduleName->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
            (&local_70," ");
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
           _M_append(&local_70,(propertyName->_M_dataplus)._M_p,propertyName->_M_string_length);
  local_50._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar4) {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
              (&local_70,local_70.field_2._M_allocated_capacity);
  }
  uVar3 = GetHash(local_50._M_dataplus._M_p,local_50._M_string_length);
  this->m_id = uVar3;
  if (propertyName->_M_string_length == 0) {
    sVar5 = 1;
  }
  else {
    sVar5 = 1;
    sVar6 = 0;
    do {
      sVar5 = sVar5 + ((propertyName->_M_dataplus)._M_p[sVar6] == ' ');
      sVar6 = sVar6 + 1;
    } while (propertyName->_M_string_length != sVar6);
  }
  this->m_partCount = sVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
              (&local_50,local_50.field_2._M_allocated_capacity);
  }
  return;
}

Assistant:

inline PropertyName::PropertyName(VisibilityType visibility, bool readOnly, const String & moduleName, const String & propertyName, const Variant & defaultValue) :
		m_visibility(visibility),
		m_readOnly(readOnly),
		m_name(propertyName),
		m_defaultValue(defaultValue)
	{
		String combinedName = moduleName + " " + propertyName;
		m_id = GetHash(combinedName.c_str(), combinedName.size());
		m_partCount = GetNamePartCount(propertyName);
	}